

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::GetPrevRealInstrOrLabel(Instr *this)

{
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte local_31;
  bool local_21;
  Instr *local_20;
  Instr *instr;
  Instr *this_local;
  
  local_20 = this->m_prev;
  while( true ) {
    IVar2 = GetKind(local_20);
    local_21 = true;
    if (IVar2 != InstrKindLabel) {
      local_21 = IsProfiledLabelInstr(local_20);
    }
    local_31 = 0;
    if (local_21 == false) {
      bVar3 = IsRealInstr(local_20);
      local_31 = bVar3 ^ 0xff;
    }
    if ((local_31 & 1) == 0) break;
    local_20 = local_20->m_prev;
    if (local_20 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb4b,"(instr)","GetPrevRealInstrOrLabel() failed...");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return local_20;
}

Assistant:

IR::Instr *
Instr::GetPrevRealInstrOrLabel() const
{
    IR::Instr *instr = this->m_prev;

    while (!instr->IsLabelInstr() && !instr->IsRealInstr())
    {
        instr = instr->m_prev;
        AssertMsg(instr, "GetPrevRealInstrOrLabel() failed...");
    }
    return instr;
}